

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_IndexSpaceI.H
# Opt level: O1

void __thiscall
amrex::EB2::IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>::IndexSpaceImp
          (IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_> *this,
          GeometryShop<amrex::EB2::SphereIF,_int> *gshop,Geometry *geom,
          int required_coarsening_level,int max_coarsening_level,int ngrow,
          bool build_coarse_level_by_coarsening,bool extend_domain_face,int num_coarsen_opt)

{
  Vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>_>_>
  *this_00;
  pointer *ppGVar1;
  pointer *ppBVar2;
  Real *pRVar3;
  iterator iVar4;
  iterator iVar5;
  iterator iVar6;
  pointer pGVar7;
  pointer pGVar8;
  Real RVar9;
  Real RVar10;
  Real RVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  long lVar15;
  long lVar16;
  bool bVar17;
  int iVar18;
  long *plVar19;
  int iVar20;
  uint uVar21;
  ulong uVar22;
  Real *pRVar23;
  size_type *psVar24;
  int iVar25;
  uint uVar26;
  uint uVar27;
  long lVar28;
  Level *this_01;
  uint uVar29;
  bool extend_domain_face_local;
  uint local_198;
  int ng;
  int local_190;
  int local_18c;
  Box cdomain;
  string __str;
  long *local_118 [2];
  long local_108 [2];
  Geometry cgeom;
  
  extend_domain_face_local = extend_domain_face;
  (this->super_IndexSpace)._vptr_IndexSpace = (_func_int **)&PTR__IndexSpaceImp_0083a188;
  RVar9 = (gshop->m_f).m_center.x;
  RVar10 = (gshop->m_f).m_center.y;
  RVar11 = (gshop->m_f).m_center.z;
  (this->m_gshop).m_f.m_radius = (gshop->m_f).m_radius;
  (this->m_gshop).m_f.m_center.x = RVar9;
  (this->m_gshop).m_f.m_center.y = RVar10;
  (this->m_gshop).m_f.m_center.z = RVar11;
  (this->m_gshop).m_f.m_sign = (gshop->m_f).m_sign;
  (this->m_gshop).m_resource = gshop->m_resource;
  this->m_build_coarse_level_by_coarsening = build_coarse_level_by_coarsening;
  this->m_extend_domain_face = extend_domain_face;
  this->m_num_coarsen_opt = num_coarsen_opt;
  this_00 = &this->m_gslevel;
  (this->m_ngrow).super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->m_ngrow).super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)0x0;
  (this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->m_ngrow).super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_gslevel).
  super_vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>_>_>
  .
  super__Vector_base<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_gslevel).
  super_vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>_>_>
  .
  super__Vector_base<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_gslevel).
  super_vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>_>_>
  .
  super__Vector_base<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_18c = required_coarsening_level;
  if (0x1e < (uint)required_coarsening_level) {
    Assert_host("required_coarsening_level >= 0 && required_coarsening_level <= 30",
                "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/EB/AMReX_EB2_IndexSpaceI.H"
                ,0xe,(char *)0x0);
  }
  iVar25 = local_18c;
  if (max_coarsening_level < local_18c) {
    max_coarsening_level = local_18c;
  }
  iVar18 = 0x1e;
  if (max_coarsening_level < 0x1e) {
    iVar18 = max_coarsening_level;
  }
  local_190 = 0;
  if (0 < ngrow) {
    local_190 = ngrow;
  }
  iVar20 = local_18c;
  if (0 < local_18c) {
    do {
      local_190 = local_190 * 2;
      iVar20 = iVar20 + -1;
    } while (iVar20 != 0);
  }
  iVar4._M_current =
       (this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
       super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar4._M_current ==
      (this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
      super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<amrex::Geometry,std::allocator<amrex::Geometry>>::
    _M_realloc_insert<amrex::Geometry_const&>
              ((vector<amrex::Geometry,std::allocator<amrex::Geometry>> *)&this->m_geom,iVar4,geom);
  }
  else {
    memcpy(iVar4._M_current,geom,200);
    ppGVar1 = &(this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
               super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppGVar1 = *ppGVar1 + 1;
  }
  iVar5._M_current =
       (this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar5._M_current ==
      (this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<amrex::Box,std::allocator<amrex::Box>>::_M_realloc_insert<amrex::Box_const&>
              ((vector<amrex::Box,std::allocator<amrex::Box>> *)&this->m_domain,iVar5,&geom->domain)
    ;
  }
  else {
    uVar12 = *(undefined8 *)(geom->domain).smallend.vect;
    uVar13 = *(undefined8 *)((geom->domain).smallend.vect + 2);
    uVar14 = *(undefined8 *)((geom->domain).bigend.vect + 2);
    *(undefined8 *)((iVar5._M_current)->bigend).vect = *(undefined8 *)(geom->domain).bigend.vect;
    *(undefined8 *)(((iVar5._M_current)->bigend).vect + 2) = uVar14;
    *(undefined8 *)((iVar5._M_current)->smallend).vect = uVar12;
    *(undefined8 *)(((iVar5._M_current)->smallend).vect + 2) = uVar13;
    ppBVar2 = &(this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppBVar2 = *ppBVar2 + 1;
  }
  iVar6._M_current =
       (this->m_ngrow).super_vector<int,_std::allocator<int>_>.
       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
  if (iVar6._M_current ==
      (this->m_ngrow).super_vector<int,_std::allocator<int>_>.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&this->m_ngrow,iVar6,&local_190);
  }
  else {
    *iVar6._M_current = local_190;
    (this->m_ngrow).super_vector<int,_std::allocator<int>_>.
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         iVar6._M_current + 1;
  }
  std::
  vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>_>_>
  ::reserve(&this_00->
             super_vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>_>_>
            ,(long)(iVar18 + 1));
  cgeom.super_CoordSys._0_8_ = this;
  std::
  vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,int>>,std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,int>>>>
  ::
  emplace_back<amrex::EB2::IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,int>>*,amrex::EB2::GeometryShop<amrex::EB2::SphereIF,int>const&,amrex::Geometry_const&,int&,int&,bool&,int&>
            ((vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,int>>,std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,int>>>>
              *)this_00,
             (IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_> **)&cgeom,gshop,
             geom,&EB2::max_grid_size,&local_190,&extend_domain_face_local,&num_coarsen_opt);
  local_198 = 1;
  if (0 < max_coarsening_level) {
    do {
      cgeom.super_CoordSys.c_sys = SPHERICAL;
      cgeom.super_CoordSys._4_4_ = 2;
      cgeom.super_CoordSys.offset[0] = (Real)CONCAT44(cgeom.super_CoordSys.offset[0]._4_4_,2);
      __str._M_dataplus._M_p = (pointer)0x200000002;
      __str._M_string_length = CONCAT44(__str._M_string_length._4_4_,2);
      bVar17 = Box::coarsenable(&(this->m_geom).
                                 super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                                 super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                 ._M_impl.super__Vector_impl_data._M_finish[-1].domain,
                                (IntVect *)&cgeom,(IntVect *)&__str);
      if (!bVar17) {
        if (iVar25 < (int)local_198) {
          return;
        }
        uVar21 = -local_198;
        if (0 < (int)local_198) {
          uVar21 = local_198;
        }
        uVar26 = 1;
        if (9 < uVar21) {
          uVar22 = (ulong)uVar21;
          uVar29 = 4;
          do {
            uVar26 = uVar29;
            uVar27 = (uint)uVar22;
            if (uVar27 < 100) {
              uVar26 = uVar26 - 2;
              goto LAB_0061c31e;
            }
            if (uVar27 < 1000) {
              uVar26 = uVar26 - 1;
              goto LAB_0061c31e;
            }
            if (uVar27 < 10000) goto LAB_0061c31e;
            uVar22 = uVar22 / 10000;
            uVar29 = uVar26 + 4;
          } while (99999 < uVar27);
          uVar26 = uVar26 + 1;
        }
LAB_0061c31e:
        uVar29 = local_198 >> 0x1f;
        __str._M_dataplus._M_p = (pointer)&__str.field_2;
        std::__cxx11::string::_M_construct
                  ((ulong)&__str,(char)uVar26 - (char)((int)local_198 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (__str._M_dataplus._M_p + uVar29,uVar26,uVar21);
        plVar19 = (long *)std::__cxx11::string::replace((ulong)&__str,0,(char *)0x0,0x789705);
        iVar25 = local_18c;
        pRVar3 = cgeom.super_CoordSys.offset + 1;
        pRVar23 = (Real *)(plVar19 + 2);
        if ((Real *)*plVar19 == pRVar23) {
          cgeom.super_CoordSys.offset[1] = *pRVar23;
          cgeom.super_CoordSys.offset[2] = (Real)plVar19[3];
          cgeom.super_CoordSys._0_8_ = pRVar3;
        }
        else {
          cgeom.super_CoordSys.offset[1] = *pRVar23;
          cgeom.super_CoordSys._0_8_ = (Real *)*plVar19;
        }
        cgeom.super_CoordSys.offset[0] = (Real)plVar19[1];
        *plVar19 = (long)pRVar23;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        Abort((string *)&cgeom);
        if ((Real *)cgeom.super_CoordSys._0_8_ != pRVar3) {
          operator_delete((void *)cgeom.super_CoordSys._0_8_,
                          (long)cgeom.super_CoordSys.offset[1] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str._M_dataplus._M_p != &__str.field_2) {
          operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
        }
      }
      ng = 0;
      if ((int)local_198 <= iVar25) {
        ng = (this->m_ngrow).super_vector<int,_std::allocator<int>_>.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
             [-1] / 2;
      }
      pGVar7 = (this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
               super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
               super__Vector_impl_data._M_finish;
      lVar28 = *(long *)pGVar7[-1].domain.smallend.vect;
      lVar15 = *(long *)(pGVar7[-1].domain.smallend.vect + 2);
      lVar16 = *(long *)pGVar7[-1].domain.bigend.vect;
      uVar12 = *(undefined8 *)(pGVar7[-1].domain.bigend.vect + 2);
      cdomain.bigend.vect[1] = (int)((ulong)lVar16 >> 0x20);
      cdomain.bigend.vect[2] = (int)uVar12;
      cdomain.btype.itype = SUB84(uVar12,4);
      cdomain.smallend.vect[2] = (int)lVar15;
      cdomain.bigend.vect[0] = (int)((ulong)lVar15 >> 0x20);
      __str._M_dataplus._M_p = (pointer)0x200000002;
      __str._M_string_length = CONCAT44(__str._M_string_length._4_4_,2);
      cdomain.smallend.vect[0] = (int)lVar28;
      if (cdomain.smallend.vect[0] < 0) {
        uVar26 = cdomain.smallend.vect[0] + 1;
        uVar21 = -uVar26;
        if (0 < (int)uVar26) {
          uVar21 = uVar26;
        }
        cdomain.smallend.vect[0] = ~(uVar21 >> 1);
      }
      else {
        cdomain.smallend.vect[0] = (uint)cdomain.smallend.vect[0] >> 1;
      }
      cdomain.smallend.vect[1] = (int)((ulong)lVar28 >> 0x20);
      if (lVar28 < 0) {
        uVar26 = cdomain.smallend.vect[1] + 1;
        uVar21 = -uVar26;
        if (0 < (int)uVar26) {
          uVar21 = uVar26;
        }
        cdomain.smallend.vect[1] = ~(uVar21 >> 1);
      }
      else {
        cdomain.smallend.vect[1] = (uint)cdomain.smallend.vect[1] >> 1;
      }
      if (cdomain.smallend.vect[2] < 0) {
        uVar26 = cdomain.smallend.vect[2] + 1;
        uVar21 = -uVar26;
        if (0 < (int)uVar26) {
          uVar21 = uVar26;
        }
        cdomain.smallend.vect[2] = ~(uVar21 >> 1);
      }
      else {
        cdomain.smallend.vect[2] = (uint)cdomain.smallend.vect[2] >> 1;
      }
      cdomain.btype.itype = SUB84(uVar12,4);
      cdomain.bigend.vect[2] = (int)uVar12;
      if (cdomain.btype.itype == 0) {
        if (lVar15 < 0) {
          uVar26 = cdomain.bigend.vect[0] + 1;
          uVar21 = -uVar26;
          if (0 < (int)uVar26) {
            uVar21 = uVar26;
          }
          cdomain.bigend.vect[0] = ~(uVar21 >> 1);
        }
        else {
          cdomain.bigend.vect[0] = (uint)cdomain.bigend.vect[0] >> 1;
        }
        if (lVar16 < 0) {
          uVar26 = cdomain.bigend.vect[1] + 1;
          uVar21 = -uVar26;
          if (0 < (int)uVar26) {
            uVar21 = uVar26;
          }
          cdomain.bigend.vect[1] = ~(uVar21 >> 1);
        }
        else {
          cdomain.bigend.vect[1] = (uint)cdomain.bigend.vect[1] >> 1;
        }
        if (cdomain.bigend.vect[2] < 0) {
          uVar26 = cdomain.bigend.vect[2] + 1;
          uVar21 = -uVar26;
          if (0 < (int)uVar26) {
            uVar21 = uVar26;
          }
          cdomain.bigend.vect[2] = ~(uVar21 >> 1);
        }
        else {
          cdomain.bigend.vect[2] = (uint)cdomain.bigend.vect[2] >> 1;
        }
      }
      else {
        cgeom.super_CoordSys.c_sys = cartesian;
        cgeom.super_CoordSys._4_4_ = 0;
        cgeom.super_CoordSys.offset[0] =
             (Real)((ulong)cgeom.super_CoordSys.offset[0] & 0xffffffff00000000);
        lVar28 = 0;
        do {
          if (((cdomain.btype.itype >> ((uint)lVar28 & 0x1f) & 1) != 0) &&
             (cdomain.bigend.vect[lVar28] % *(int *)((long)&__str._M_dataplus._M_p + lVar28 * 4) !=
              0)) {
            *(undefined4 *)((long)cgeom.super_CoordSys.offset + lVar28 * 4 + -8) = 1;
          }
          lVar28 = lVar28 + 1;
        } while (lVar28 != 3);
        if (lVar15 < 0) {
          uVar26 = cdomain.bigend.vect[0] + 1;
          uVar21 = -uVar26;
          if (0 < (int)uVar26) {
            uVar21 = uVar26;
          }
          uVar21 = ~(uVar21 >> 1);
        }
        else {
          uVar21 = (uint)cdomain.bigend.vect[0] >> 1;
        }
        if (lVar16 < 0) {
          uVar29 = cdomain.bigend.vect[1] + 1;
          uVar26 = -uVar29;
          if (0 < (int)uVar29) {
            uVar26 = uVar29;
          }
          uVar26 = ~(uVar26 >> 1);
        }
        else {
          uVar26 = (uint)cdomain.bigend.vect[1] >> 1;
        }
        if (cdomain.bigend.vect[2] < 0) {
          uVar27 = cdomain.bigend.vect[2] + 1;
          uVar29 = -uVar27;
          if (0 < (int)uVar27) {
            uVar29 = uVar27;
          }
          uVar29 = ~(uVar29 >> 1);
        }
        else {
          uVar29 = (uint)cdomain.bigend.vect[2] >> 1;
        }
        cdomain.bigend.vect[0] = uVar21 + cgeom.super_CoordSys.c_sys;
        cdomain.bigend.vect[1] = uVar26 + cgeom.super_CoordSys._4_4_;
        cdomain.bigend.vect[2] = uVar29 + cgeom.super_CoordSys.offset[0]._0_4_;
      }
      __str._M_dataplus._M_p = (pointer)0x200000002;
      __str._M_string_length = CONCAT44(__str._M_string_length._4_4_,2);
      memcpy(&cgeom,pGVar7 + -1,200);
      Geometry::coarsen(&cgeom,(IntVect *)&__str);
      __str._M_dataplus._M_p = (pointer)this;
      std::
      vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,int>>,std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,int>>>>
      ::
      emplace_back<amrex::EB2::IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,int>>*,int&,int&,int&,amrex::Geometry&,amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,int>>&>
                ((vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,int>>,std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,int>>>>
                  *)this_00,
                 (IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_> **)&__str,
                 (int *)&local_198,&EB2::max_grid_size,&ng,&cgeom,
                 (this->m_gslevel).
                 super_vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>_>_>
                 .
                 super__Vector_base<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + (long)(int)local_198 + -1);
      pGVar8 = (this->m_gslevel).
               super_vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>_>_>
               .
               super__Vector_base<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pGVar8[-1].super_Level.m_ok == false) {
        this_01 = &pGVar8[-1].super_Level;
        (this->m_gslevel).
        super_vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>_>_>
        .
        super__Vector_base<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)this_01;
        Level::~Level(this_01);
        if (iVar25 < (int)local_198) {
          return;
        }
        if (build_coarse_level_by_coarsening) {
          uVar21 = -local_198;
          if (0 < (int)local_198) {
            uVar21 = local_198;
          }
          uVar26 = 1;
          if (9 < uVar21) {
            uVar22 = (ulong)uVar21;
            uVar29 = 4;
            do {
              uVar26 = uVar29;
              uVar27 = (uint)uVar22;
              if (uVar27 < 100) {
                uVar26 = uVar26 - 2;
                goto LAB_0061c72e;
              }
              if (uVar27 < 1000) {
                uVar26 = uVar26 - 1;
                goto LAB_0061c72e;
              }
              if (uVar27 < 10000) goto LAB_0061c72e;
              uVar22 = uVar22 / 10000;
              uVar29 = uVar26 + 4;
            } while (99999 < uVar27);
            uVar26 = uVar26 + 1;
          }
LAB_0061c72e:
          uVar29 = local_198 >> 0x1f;
          local_118[0] = local_108;
          std::__cxx11::string::_M_construct
                    ((ulong)local_118,(char)uVar26 - (char)((int)local_198 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)((ulong)uVar29 + (long)local_118[0]),uVar26,uVar21);
          plVar19 = (long *)std::__cxx11::string::replace((ulong)local_118,0,(char *)0x0,0x789738);
          iVar25 = local_18c;
          __str._M_dataplus._M_p = (pointer)&__str.field_2;
          psVar24 = (size_type *)(plVar19 + 2);
          if ((size_type *)*plVar19 == psVar24) {
            __str.field_2._M_allocated_capacity = *psVar24;
            __str.field_2._8_8_ = plVar19[3];
          }
          else {
            __str.field_2._M_allocated_capacity = *psVar24;
            __str._M_dataplus._M_p = (pointer)*plVar19;
          }
          __str._M_string_length = plVar19[1];
          *plVar19 = (long)psVar24;
          plVar19[1] = 0;
          *(undefined1 *)(plVar19 + 2) = 0;
          Abort(&__str);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str._M_dataplus._M_p != &__str.field_2) {
            operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
          }
          if (local_118[0] != local_108) {
            operator_delete(local_118[0],local_108[0] + 1);
          }
        }
        else {
          local_118[0] = (long *)CONCAT44(local_118[0]._4_4_,num_coarsen_opt - local_198);
          __str._M_dataplus._M_p = (pointer)this;
          std::
          vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,int>>,std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,int>>>>
          ::
          emplace_back<amrex::EB2::IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,int>>*,amrex::EB2::GeometryShop<amrex::EB2::SphereIF,int>const&,amrex::Geometry&,int&,int&,bool&,int>
                    ((vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,int>>,std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,int>>>>
                      *)this_00,
                     (IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_> **)&__str,
                     gshop,&cgeom,&EB2::max_grid_size,&ng,&extend_domain_face_local,(int *)local_118
                    );
        }
      }
      iVar4._M_current =
           (this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
           super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
          super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<amrex::Geometry,std::allocator<amrex::Geometry>>::
        _M_realloc_insert<amrex::Geometry_const&>
                  ((vector<amrex::Geometry,std::allocator<amrex::Geometry>> *)&this->m_geom,iVar4,
                   &cgeom);
      }
      else {
        memcpy(iVar4._M_current,&cgeom,200);
        ppGVar1 = &(this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                   super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppGVar1 = *ppGVar1 + 1;
      }
      iVar5._M_current =
           (this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<amrex::Box,std::allocator<amrex::Box>>::_M_realloc_insert<amrex::Box_const&>
                  ((vector<amrex::Box,std::allocator<amrex::Box>> *)&this->m_domain,iVar5,&cdomain);
      }
      else {
        *(ulong *)((iVar5._M_current)->bigend).vect =
             CONCAT44(cdomain.bigend.vect[1],cdomain.bigend.vect[0]);
        *(undefined8 *)(((iVar5._M_current)->bigend).vect + 2) = cdomain._20_8_;
        *(undefined8 *)((iVar5._M_current)->smallend).vect = cdomain.smallend.vect._0_8_;
        *(ulong *)(((iVar5._M_current)->smallend).vect + 2) =
             CONCAT44(cdomain.bigend.vect[0],cdomain.smallend.vect[2]);
        ppBVar2 = &(this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppBVar2 = *ppBVar2 + 1;
      }
      iVar6._M_current =
           (this->m_ngrow).super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (this->m_ngrow).super_vector<int,_std::allocator<int>_>.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->m_ngrow,iVar6,&ng);
      }
      else {
        *iVar6._M_current = ng;
        (this->m_ngrow).super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
             iVar6._M_current + 1;
      }
      bVar17 = (int)local_198 < iVar18;
      local_198 = local_198 + 1;
    } while (bVar17);
  }
  return;
}

Assistant:

IndexSpaceImp<G>::IndexSpaceImp (const G& gshop, const Geometry& geom,
                                 int required_coarsening_level,
                                 int max_coarsening_level,
                                 int ngrow, bool build_coarse_level_by_coarsening,
                                 bool extend_domain_face, int num_coarsen_opt)
    : m_gshop(gshop),
      m_build_coarse_level_by_coarsening(build_coarse_level_by_coarsening),
      m_extend_domain_face(extend_domain_face),
      m_num_coarsen_opt(num_coarsen_opt)
{
    // build finest level (i.e., level 0) first
    AMREX_ALWAYS_ASSERT(required_coarsening_level >= 0 && required_coarsening_level <= 30);
    max_coarsening_level = std::max(required_coarsening_level,max_coarsening_level);
    max_coarsening_level = std::min(30,max_coarsening_level);

    int ngrow_finest = std::max(ngrow,0);
    for (int i = 1; i <= required_coarsening_level; ++i) {
        ngrow_finest *= 2;
    }

    m_geom.push_back(geom);
    m_domain.push_back(geom.Domain());
    m_ngrow.push_back(ngrow_finest);
    m_gslevel.reserve(max_coarsening_level+1);
    m_gslevel.emplace_back(this, gshop, geom, EB2::max_grid_size, ngrow_finest, extend_domain_face,
                           num_coarsen_opt);

    for (int ilev = 1; ilev <= max_coarsening_level; ++ilev)
    {
        bool coarsenable = m_geom.back().Domain().coarsenable(2,2);
        if (!coarsenable) {
            if (ilev <= required_coarsening_level) {
                amrex::Abort("IndexSpaceImp: domain is not coarsenable at level "+std::to_string(ilev));
            } else {
                break;
            }
        }

        int ng = (ilev > required_coarsening_level) ? 0 : m_ngrow.back()/2;

        Box cdomain = amrex::coarsen(m_geom.back().Domain(),2);
        Geometry cgeom = amrex::coarsen(m_geom.back(),2);
        m_gslevel.emplace_back(this, ilev, EB2::max_grid_size, ng, cgeom, m_gslevel[ilev-1]);
        if (!m_gslevel.back().isOK()) {
            m_gslevel.pop_back();
            if (ilev <= required_coarsening_level) {
                if (build_coarse_level_by_coarsening) {
                    amrex::Abort("Failed to build required coarse EB level "+std::to_string(ilev));
                } else {
                    m_gslevel.emplace_back(this, gshop, cgeom, EB2::max_grid_size, ng, extend_domain_face,
                                           num_coarsen_opt-ilev);
                }
            } else {
                break;
            }
        }
        m_geom.push_back(cgeom);
        m_domain.push_back(cdomain);
        m_ngrow.push_back(ng);
    }
}